

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  ulong in_RAX;
  uint uVar1;
  uint uVar2;
  undefined8 uStack_38;
  
  uVar2 = 0;
  uStack_38 = in_RAX;
  do {
    if (0xffff < (int)uVar2) {
      uStack_38 = uStack_38 & 0xffffffffffff;
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 6));
      return;
    }
    if ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) != 0) {
      uStack_38._0_6_ = CONCAT24((short)uVar2,(undefined4)uStack_38);
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 4));
      uVar1 = uVar2;
      do {
        uVar2 = uVar1;
        if (uVar2 == 0x10000) break;
        uVar1 = uVar2 + 1;
      } while ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar1 >> 5) * 4) >> (uVar1 & 0x1f) & 1)
               != 0);
      uStack_38._0_4_ = CONCAT22((short)uVar2,(undefined2)uStack_38);
      ImVector<unsigned_short>::push_back(out_ranges,(unsigned_short *)((long)&uStack_38 + 2));
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}